

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O2

void __thiscall tst_future::finallyRejected(tst_future *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  char16_t *pcVar3;
  bool bVar4;
  PromiseData<int> *pPVar5;
  QPromiseReject<int> *in_R8;
  char *reject;
  PromiseResolver<int> resolver_2;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_178;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_170;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_168;
  _Any_data local_160;
  undefined **local_150;
  PromiseData<int> *local_148;
  QPromiseBase<int> local_140;
  QPromise<int> p;
  QPromise<int> output;
  QString error;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f0;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type p_Stack_d0;
  PromiseResolver<void> resolver;
  _Any_data local_a8 [2];
  Type input;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<int> local_38;
  
  local_160._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&input,(int *)local_160._M_pod_data);
  p.super_QPromiseBase<int>.m_d = input.super_QPromiseBase<int>.m_d;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
              ).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129808;
  error.d.d = (Data *)&PTR__QPromiseBase_00129570;
  pPVar5 = (PromiseData<int> *)operator_new(0x58);
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
    m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
    super_QSharedData = 0;
  (((PromiseDataBase<void,_void_()> *)&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar5);
  LOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)
            &pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)
              &pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._M_unused._M_object = &PTR__QPromiseBase_001296f8;
  error.d.ptr = (char16_t *)pPVar5;
  local_e8._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_e8);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_140._vptr_QPromiseBase = (_func_int **)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)resolver.m_d.d;
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_160._M_unused._0_8_ = resolver.m_d.d;
  local_160._8_8_ = resolver_1.m_d.d;
  local_a8[0]._0_8_ = resolver.m_d.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_160._8_8_;
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
  }
  pcStack_40 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_future::finallyRejected()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_future::finallyRejected()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_160._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  local_160._M_unused._M_object = (void *)local_a8[0]._0_8_;
  if ((Data *)local_a8[0]._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_a8[0]._0_8_ = *(int *)local_a8[0]._0_8_ + 1;
    UNLOCK();
  }
  local_160._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_160._8_8_;
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
  }
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_future::finallyRejected()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_future::finallyRejected()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_160._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_2);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)local_a8
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  error.d.d = (Data *)&PTR__QPromiseBase_001296f8;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_140.m_d.d = p.super_QPromiseBase<int>.m_d.d;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129808;
  output.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001295a0;
  pPVar5 = (PromiseData<int> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._M_unused._M_object = &PTR__QPromiseBase_00129808;
  output.super_QPromiseBase<int>.m_d.d = pPVar5;
  local_e8._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_e8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_e8);
  pcVar3 = error.d.ptr;
  if (resolver_1.m_d.d == (Data *)0x0) {
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    resolver_2 = resolver_1;
  }
  local_170.d = (Data *)0x0;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_178.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_178 = resolver_2.m_d.d;
  }
  local_168.d = (Data *)0x0;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_2.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_178.d != (Data *)0x0) {
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148 = local_140.m_d.d;
  if (local_140.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_140.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_150 = &PTR__QPromiseBase_00129808;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  local_160._M_unused._0_8_ = resolver_2.m_d.d;
  local_160._8_8_ = local_178.d;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)local_160._8_8_;
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_001295a0;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<void> *)local_148;
  if (local_148 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(local_148->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00129808;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<int>::finally<tst_future::finallyRejected()::$_0>(tst_future::finallyRejected()::$_0)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::finally<tst_future::finallyRejected()::$_0>(tst_future::finallyRejected()::$_0)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_160._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)pcVar3,(function<void_()> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  pcVar3 = error.d.ptr;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_a8,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&resolver_2,
             (QPromiseResolve<int> *)&local_178,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)pcVar3,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_a8);
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_178);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  output.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129808;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)error.d.ptr);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)error.d.ptr);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_140);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&error);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_e8._M_pod_data[0] = 1;
  local_160._M_pod_data[0] = bVar4;
  bVar4 = QTest::qCompare<bool,bool>
                    ((bool *)local_160._M_pod_data,(bool *)local_e8._M_pod_data,
                     "input.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x161);
  if (bVar4) {
    local_160._M_pod_data[0] =
         QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                   (&(output.super_QPromiseBase<int>.m_d.d)->
                     super_PromiseDataBase<int,_void_(const_int_&)>);
    local_e8._M_pod_data[0] = 1;
    reject = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
    ;
    bVar4 = QTest::qCompare<bool,bool>
                      ((bool *)local_160._M_pod_data,(bool *)local_e8._M_pod_data,
                       "output.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x162);
    if (bVar4) {
      error.d.d = (Data *)0x0;
      error.d.ptr = (char16_t *)0x0;
      error.d.size = 0;
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           &PTR__QPromiseBase_001295a0;
      pPVar5 = (PromiseData<int> *)operator_new(0x68);
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
      (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0
      ;
      (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
      LOCK();
      pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (pPVar5 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129808;
      local_140.m_d.d = pPVar5;
      QtPromisePrivate::PromiseResolver<int>::PromiseResolver
                (&resolver_2,(QPromise<int> *)&local_140);
      QtPromise::QPromiseBase<int>::~QPromiseBase(&local_140);
      QVar2 = output.super_QPromiseBase<int>.m_d;
      if (resolver_2.m_d.d == (Data *)0x0) {
        local_170.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
        local_170 = resolver_2.m_d.d;
      }
      local_178.d = (Data *)0x0;
      if (local_170.d == (Data *)0x0) {
        local_168.d = (Data *)0x0;
      }
      else {
        LOCK();
        ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_168.d = local_170.d;
      }
      local_f0.d = (Data *)0x0;
      QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
                ((function<void_(const_int_&)> *)&local_160,
                 (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_170,
                 (QPromiseResolve<int> *)&local_168,(QPromiseReject<int> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&local_160);
      std::_Function_base::~_Function_base((_Function_base *)&local_160);
      QVar2 = output.super_QPromiseBase<int>.m_d;
      p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_170.d;
      if (local_170.d != (Data *)0x0) {
        LOCK();
        ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)local_168.d;
      if ((PromiseData<int> *)local_168.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_168.d)->super_QSharedData)->
          _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value
        .super___atomic_base<int>._M_i =
             (((QAtomicInt *)
              &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_168.d)->super_QSharedData)->
               _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8._M_unused._M_object = (_func_int **)0x0;
      local_e8._8_8_ = (PromiseData<int> *)0x0;
      local_d8 = (_Manager_type)0x0;
      p_Stack_d0 = (_Invoker_type)0x0;
      local_e8._M_unused._M_object = operator_new(0x18);
      *(_func_int ***)local_e8._M_unused._0_8_ = p.super_QPromiseBase<int>._vptr_QPromiseBase;
      if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
        LOCK();
        *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
             *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
        UNLOCK();
      }
      *(PromiseData<int> **)((long)local_e8._M_unused._0_8_ + 8) = p.super_QPromiseBase<int>.m_d.d;
      if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        *(int *)&((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                 ._vptr_PromiseDataBase =
             *(int *)&((p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase + 1;
        UNLOCK();
      }
      *(QPromiseBase<void> **)((long)local_e8._M_unused._0_8_ + 0x10) = (QPromiseBase<void> *)&error
      ;
      p_Stack_d0 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_invoke;
      local_d8 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
      QtPromisePrivate::PromiseCatcher<int,tst_future::finallyRejected()::$_1,MyException_const&>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_future::finallyRejected()::$_1_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
      ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&p);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_e8);
      std::_Function_base::~_Function_base((_Function_base *)&local_e8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
      ~QExplicitlySharedDataPointer(&local_168);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
      ~QExplicitlySharedDataPointer(&local_f0);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
      ~QExplicitlySharedDataPointer(&local_170);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
      ~QExplicitlySharedDataPointer(&local_178);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
      ~QExplicitlySharedDataPointer(&resolver_2.m_d);
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           &PTR__QPromiseBase_00129808;
      bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (&(output.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar4) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(output.super_QPromiseBase<int>.m_d.d)->
                    super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      QtPromise::QPromiseBase<int>::wait(&local_38,&resolver_1);
      QtPromise::QPromiseBase<int>::~QPromiseBase(&local_38);
      QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_1);
      bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isRejected
                        (&(output.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      p.super_QPromiseBase<int>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(p.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar4);
      local_140._vptr_QPromiseBase = (_func_int **)CONCAT71(local_140._vptr_QPromiseBase._1_7_,1);
      bVar4 = QTest::qCompare<bool,bool>
                        ((bool *)&p,(bool *)&local_140,"output.isRejected()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x16c);
      if (bVar4) {
        QString::QString((QString *)&p,"foo");
        QTest::qCompare(&error,(QString *)&p,"error","QString{\"foo\"}",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                        ,0x16d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&error.d);
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&output.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_future::finallyRejected()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            throw MyException{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    QString error;
    output
        .fail([&](const MyException& e) {
            error = e.error();
            return -1;
        })
        .wait();

    QCOMPARE(output.isRejected(), true);
    QCOMPARE(error, QString{"foo"});
}